

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_model_v2.c
# Opt level: O0

RK_S32 moving_judge_update(RcModelV2Ctx *ctx,EncRcTaskInfo *cfg)

{
  EncRcTaskInfo *cfg_local;
  RcModelV2Ctx *ctx_local;
  
  if (cfg->frame_type == INTER_P_FRAME) {
    mpp_data_update_v2(ctx->pre_p_bit,cfg->bit_real);
    mpp_data_update_v2(ctx->madp,cfg->madp);
  }
  else if (cfg->frame_type == INTRA_FRAME) {
    mpp_data_update_v2(ctx->pre_i_bit,cfg->bit_real);
    mpp_data_update_v2(ctx->pre_i_mean_qp,cfg->quality_real);
  }
  return 0;
}

Assistant:

RK_S32 moving_judge_update(RcModelV2Ctx *ctx, EncRcTaskInfo *cfg)
{
    switch (cfg->frame_type) {
    case INTRA_FRAME: {
        mpp_data_update_v2(ctx->pre_i_bit, cfg->bit_real);
        mpp_data_update_v2(ctx->pre_i_mean_qp, cfg->quality_real);
    } break;

    case INTER_P_FRAME: {
        mpp_data_update_v2(ctx->pre_p_bit, cfg->bit_real);
        mpp_data_update_v2(ctx->madp, cfg->madp);
    } break;

    default:
        break;
    }
    return 0;
}